

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioRead.c
# Opt level: O2

char * Mio_LibraryCleanStr(char *p)

{
  byte *pbVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  byte *pbVar5;
  char cVar6;
  byte bVar7;
  ulong uVar8;
  bool bVar9;
  
  pbVar1 = (byte *)Abc_UtilStrsav(p);
  iVar3 = 0;
  iVar2 = 0;
  cVar6 = '\0';
  pbVar5 = pbVar1;
  do {
    bVar7 = *pbVar5;
    uVar8 = (ulong)bVar7;
    iVar4 = iVar3;
    if (uVar8 < 0x2c) {
      if ((0xfc200000000U >> (uVar8 & 0x3f) & 1) != 0) goto LAB_0036cf81;
      if ((0x100002600U >> (uVar8 & 0x3f) & 1) == 0) {
        if (uVar8 == 0) {
          pbVar1[iVar3] = 0;
          return (char *)pbVar1;
        }
        goto LAB_0036cfaf;
      }
      bVar9 = iVar2 != 0;
      iVar2 = (uint)bVar9 * 2;
      cVar6 = bVar9 * '\x02';
    }
    else {
LAB_0036cfaf:
      if ((bVar7 == 0x5e) || (bVar7 == 0x7c)) {
LAB_0036cf81:
        iVar2 = 0;
        cVar6 = '\0';
      }
      else {
        bVar9 = cVar6 == '\x02';
        iVar2 = 1;
        cVar6 = '\x01';
        if (bVar9) {
          iVar4 = iVar3 + 1;
          pbVar1[iVar3] = 0x20;
          bVar7 = *pbVar5;
        }
      }
      iVar3 = iVar4 + 1;
      pbVar1[iVar4] = bVar7;
    }
    pbVar5 = pbVar5 + 1;
  } while( true );
}

Assistant:

char * Mio_LibraryCleanStr( char * p )
{
    int i, k;
    int whitespace_state = 0;
    char * pRes = Abc_UtilStrsav( p );
    for ( i = k = 0; pRes[i]; i++ )
        if ( pRes[i] != ' ' && pRes[i] != '\t' && pRes[i] != '\r' && pRes[i] != '\n' ) 
        {
            if ( pRes[i] != '(' && pRes[i] != ')' && pRes[i] != '+' && pRes[i] != '*' && pRes[i] != '|' && pRes[i] != '&' && pRes[i] != '^' && pRes[i] != '\'' && pRes[i] != '!' ) 
            {
                if (whitespace_state == 2)
                    pRes[k++] = ' ';
                whitespace_state = 1;
            } 
            else
                whitespace_state = 0;
            pRes[k++] = pRes[i];
        } 
        else
            whitespace_state = whitespace_state ? 2 : 0;
    pRes[k] = 0;
    return pRes;
}